

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  char *s1;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  uint uVar16;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  undefined1 auVar17 [32];
  __m256i *palVar18;
  int iVar19;
  uint uVar20;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  ulong uVar21;
  parasail_result_t *result_00;
  __m256i *b;
  __m256i *b_00;
  __m256i *palVar22;
  __m256i *b_01;
  __m256i *palVar23;
  __m256i *b_02;
  __m256i *palVar24;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *ptr;
  __m256i *ptr_00;
  int iVar25;
  int iVar26;
  int iVar27;
  __m256i *ptr_01;
  long lVar28;
  __m256i *palVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  __m256i *palVar34;
  __m256i *palVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar41 [16];
  undefined1 auVar46 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar48 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  int iVar67;
  __m256i *palVar68;
  undefined4 uVar69;
  __m256i *local_258;
  __m256i *local_250;
  __m256i *local_208;
  undefined1 local_1d8 [32];
  __m256i *local_188;
  undefined4 local_d8;
  undefined4 uStack_d4;
  
  s1 = profile->s1;
  ppVar5 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_32(profile,s2,s2Len,open,gap);
  iVar19 = parasail_result_is_saturated(result);
  if (iVar19 != 0) {
    return result;
  }
  iVar19 = result->end_query;
  iVar4 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_32(s1,iVar19 + 1,ppVar5);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar6 = (profile_00->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_stats_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar5 = profile_00->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar32 = profile_00->s1Len;
        uVar21 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_4();
        }
        else if (iVar4 < 0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_striped_profile_avx2_256_32_cold_1();
        }
        else {
          pvVar7 = (profile_00->profile32).matches;
          pvVar8 = (profile_00->profile32).similar;
          iVar26 = ppVar5->max;
          result_00 = parasail_result_new_stats();
          if (result_00 != (parasail_result_t *)0x0) {
            uVar36 = uVar21 + 7 >> 3;
            result_00->flag = result_00->flag | 0x8410804;
            b = parasail_memalign___m256i(0x20,uVar36);
            local_258 = parasail_memalign___m256i(0x20,uVar36);
            b_00 = parasail_memalign___m256i(0x20,uVar36);
            palVar22 = parasail_memalign___m256i(0x20,uVar36);
            b_01 = parasail_memalign___m256i(0x20,uVar36);
            palVar23 = parasail_memalign___m256i(0x20,uVar36);
            b_02 = parasail_memalign___m256i(0x20,uVar36);
            palVar24 = parasail_memalign___m256i(0x20,uVar36);
            b_03 = parasail_memalign___m256i(0x20,uVar36);
            b_04 = parasail_memalign___m256i(0x20,uVar36);
            b_05 = parasail_memalign___m256i(0x20,uVar36);
            b_06 = parasail_memalign___m256i(0x20,uVar36);
            local_250 = parasail_memalign___m256i(0x20,uVar36);
            ptr = parasail_memalign___m256i(0x20,uVar36);
            local_208 = parasail_memalign___m256i(0x20,uVar36);
            ptr_00 = parasail_memalign___m256i(0x20,uVar36);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_258;
            auVar54 = vpunpcklqdq_avx(auVar54,auVar55);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = b_00;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = palVar22;
            auVar55 = vpunpcklqdq_avx(auVar37,auVar40);
            auVar37 = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar54;
            auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = b_01;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = palVar23;
            auVar54 = vpunpcklqdq_avx(auVar41,auVar46);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = b_02;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = palVar24;
            auVar55 = vpunpcklqdq_avx(auVar47,auVar50);
            auVar41 = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar54;
            auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_03;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = b_04;
            auVar54 = vpunpcklqdq_avx(auVar49,auVar51);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_05;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = b_06;
            auVar55 = vpunpcklqdq_avx(auVar52,auVar56);
            auVar47 = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar54;
            auVar49 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_250;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = ptr;
            auVar54 = vpunpcklqdq_avx(auVar53,auVar57);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = local_208;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = ptr_00;
            auVar55 = vpunpcklqdq_avx(auVar58,auVar59);
            auVar54 = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar54;
            auVar55 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
            auVar38._0_8_ = -(ulong)(auVar37._0_8_ == 0);
            auVar38._8_8_ = -(ulong)(auVar37._8_8_ == 0);
            auVar38._16_8_ = -(ulong)(auVar40._0_8_ == 0);
            auVar38._24_8_ = -(ulong)(auVar40._8_8_ == 0);
            auVar43._0_8_ = -(ulong)(auVar41._0_8_ == 0);
            auVar43._8_8_ = -(ulong)(auVar41._8_8_ == 0);
            auVar43._16_8_ = -(ulong)(auVar46._0_8_ == 0);
            auVar43._24_8_ = -(ulong)(auVar46._8_8_ == 0);
            auVar38 = vpackssdw_avx2(auVar38,auVar43);
            auVar43 = vpermq_avx2(auVar38,0xd8);
            auVar42._0_8_ = -(ulong)(auVar47._0_8_ == 0);
            auVar42._8_8_ = -(ulong)(auVar47._8_8_ == 0);
            auVar42._16_8_ = -(ulong)(auVar49._0_8_ == 0);
            auVar42._24_8_ = -(ulong)(auVar49._8_8_ == 0);
            auVar48._0_8_ = -(ulong)(auVar54._0_8_ == 0);
            auVar48._8_8_ = -(ulong)(auVar54._8_8_ == 0);
            auVar48._16_8_ = -(ulong)(auVar55._0_8_ == 0);
            auVar48._24_8_ = -(ulong)(auVar55._8_8_ == 0);
            auVar38 = vpackssdw_avx2(auVar42,auVar48);
            auVar38 = vpermq_avx2(auVar38,0xd8);
            auVar38 = vpackssdw_avx2(auVar43,auVar38);
            if ((((((((((((((((auVar38 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar38 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar38 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar38 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar38 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar38 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar38 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar38 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                -1 < auVar38[0x1f]) {
              iVar30 = 0;
              uVar69 = 0;
              alVar1[0]._4_4_ = in_stack_fffffffffffffd8c;
              alVar1[0]._0_4_ = in_stack_fffffffffffffd88;
              alVar1[1] = (longlong)ptr;
              alVar1[2] = (longlong)palVar22;
              alVar1[3] = 0;
              parasail_memset___m256i(b,alVar1,uVar36);
              c[0]._4_4_ = in_stack_fffffffffffffd8c;
              c[0]._0_4_ = in_stack_fffffffffffffd88;
              c[1] = (longlong)ptr;
              c[2] = (longlong)palVar22;
              c[3]._0_4_ = iVar30;
              c[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_00,c,uVar36);
              c_00[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_00[0]._0_4_ = in_stack_fffffffffffffd88;
              c_00[1] = (longlong)ptr;
              c_00[2] = (longlong)palVar22;
              c_00[3]._0_4_ = iVar30;
              c_00[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_01,c_00,uVar36);
              c_01[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_01[0]._0_4_ = in_stack_fffffffffffffd88;
              c_01[1] = (longlong)ptr;
              c_01[2] = (longlong)palVar22;
              c_01[3]._0_4_ = iVar30;
              c_01[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_02,c_01,uVar36);
              c_02[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_02[0]._0_4_ = in_stack_fffffffffffffd88;
              c_02[1] = (longlong)ptr;
              c_02[2] = (longlong)palVar22;
              c_02[3]._0_4_ = iVar30;
              c_02[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_03,c_02,uVar36);
              c_03[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_03[0]._0_4_ = in_stack_fffffffffffffd88;
              c_03[1] = (longlong)ptr;
              c_03[2] = (longlong)palVar22;
              c_03[3]._0_4_ = iVar30;
              c_03[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_04,c_03,uVar36);
              c_04[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_04[0]._0_4_ = in_stack_fffffffffffffd88;
              c_04[1] = (longlong)ptr;
              c_04[2] = (longlong)palVar22;
              c_04[3]._0_4_ = iVar30;
              c_04[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_05,c_04,uVar36);
              c_05[0]._4_4_ = in_stack_fffffffffffffd8c;
              c_05[0]._0_4_ = in_stack_fffffffffffffd88;
              c_05[1] = (longlong)ptr;
              c_05[2] = (longlong)palVar22;
              c_05[3]._0_4_ = iVar30;
              c_05[3]._4_4_ = uVar69;
              parasail_memset___m256i(b_06,c_05,uVar36);
              uVar16 = (uint)uVar36;
              uVar20 = uVar16 - 1;
              iVar67 = -0x40000000;
              uVar31 = 0;
              auVar66 = ZEXT1664((undefined1  [16])0x0);
              auVar45 = ZEXT1664((undefined1  [16])0x0);
              auVar61 = ZEXT1664((undefined1  [16])0x0);
              do {
                palVar34 = b_01;
                palVar68 = b_00;
                ptr_01 = b_02;
                palVar29 = b;
                local_1d8 = auVar66._0_32_;
                auVar38 = auVar45._0_32_;
                lVar33 = (long)(int)(ppVar5->mapper[(byte)s2[uVar31]] * uVar16) * 0x20;
                iVar25 = (int)uVar31 + -2;
                b = local_258;
                b_01 = palVar23;
                palVar35 = ptr;
                palVar18 = ptr_00;
                b_02 = palVar24;
                b_00 = palVar22;
                if (iVar30 == iVar25) {
                  b = local_250;
                  b_01 = local_208;
                  palVar35 = palVar22;
                  palVar18 = palVar24;
                  b_02 = ptr_00;
                  b_00 = ptr;
                }
                ptr_00 = palVar18;
                ptr = palVar35;
                alVar1 = ptr_01[uVar20];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar10 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xc);
                alVar1 = palVar34[uVar20];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar48 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xc);
                alVar1 = palVar68[uVar20];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar42 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xc);
                alVar1 = palVar29[uVar20];
                auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar43 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xc);
                auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar9._8_4_ = 1;
                auVar9._0_8_ = 0x100000001;
                auVar9._12_4_ = 1;
                auVar9._16_4_ = 1;
                auVar9._20_4_ = 1;
                auVar9._24_4_ = 1;
                auVar9._28_4_ = 1;
                auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar65 = ZEXT1664((undefined1  [16])0x0);
                lVar28 = 0;
                do {
                  auVar44 = *(undefined1 (*) [32])((long)*b_03 + lVar28);
                  auVar2 = *(undefined1 (*) [32])((long)*b_04 + lVar28);
                  auVar39 = *(undefined1 (*) [32])((long)*b_05 + lVar28);
                  auVar3 = *(undefined1 (*) [32])((long)*b_06 + lVar28);
                  auVar43 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar28 + lVar33));
                  auVar43 = vpmaxsd_avx2(auVar43,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar13 = vpmaxsd_avx2(auVar43,auVar44);
                  auVar63 = auVar65._0_32_;
                  auVar14 = vpmaxsd_avx2(auVar13,auVar63);
                  *(undefined1 (*) [32])((long)*b + lVar28) = auVar14;
                  auVar11 = vpcmpeqd_avx2(auVar43,auVar14);
                  auVar12 = vpcmpgtd_avx2(auVar13,auVar63);
                  auVar43 = vblendvps_avx(auVar60._0_32_,auVar2,auVar12);
                  auVar42 = vpaddd_avx2(auVar42,*(undefined1 (*) [32])
                                                 ((long)pvVar7 + lVar28 + lVar33));
                  auVar43 = vblendvps_avx(auVar43,auVar42,auVar11);
                  auVar64 = vpcmpeqd_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar13 = vpandn_avx2(auVar64,auVar43);
                  *(undefined1 (*) [32])((long)*b_00 + lVar28) = auVar13;
                  auVar43 = vblendvps_avx(auVar45._0_32_,auVar39,auVar12);
                  auVar42 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar28 + lVar33));
                  auVar43 = vblendvps_avx(auVar43,auVar42,auVar11);
                  auVar42 = vblendvps_avx(auVar9,auVar3,auVar12);
                  auVar48 = vpsubd_avx2(auVar10,_DAT_00909280);
                  auVar42 = vblendvps_avx(auVar42,auVar48,auVar11);
                  auVar10 = vpandn_avx2(auVar64,auVar43);
                  *(undefined1 (*) [32])((long)*b_01 + lVar28) = auVar10;
                  auVar48 = vpandn_avx2(auVar64,auVar42);
                  *(undefined1 (*) [32])((long)*b_02 + lVar28) = auVar48;
                  auVar43 = vpmaxsd_avx2(auVar13,local_1d8);
                  auVar42 = vpmaxsd_avx2(auVar10,auVar48);
                  local_1d8 = vpmaxsd_avx2(auVar43,auVar42);
                  auVar11._4_4_ = open;
                  auVar11._0_4_ = open;
                  auVar11._8_4_ = open;
                  auVar11._12_4_ = open;
                  auVar11._16_4_ = open;
                  auVar11._20_4_ = open;
                  auVar11._24_4_ = open;
                  auVar11._28_4_ = open;
                  auVar12 = vpsubd_avx2(auVar14,auVar11);
                  auVar17._4_4_ = gap;
                  auVar17._0_4_ = gap;
                  auVar17._8_4_ = gap;
                  auVar17._12_4_ = gap;
                  auVar17._16_4_ = gap;
                  auVar17._20_4_ = gap;
                  auVar17._24_4_ = gap;
                  auVar17._28_4_ = gap;
                  auVar15 = vpsubd_avx2(auVar44,auVar17);
                  auVar11 = vpcmpgtd_avx2(auVar12,auVar15);
                  auVar43 = vblendvps_avx(auVar2,auVar13,auVar11);
                  auVar64 = vpmaxsd_avx2(auVar14,auVar61._0_32_);
                  auVar61 = ZEXT3264(auVar64);
                  auVar42 = vblendvps_avx(auVar39,auVar10,auVar11);
                  auVar44 = vpcmpeqd_avx2(auVar2,auVar2);
                  auVar2 = vpsubd_avx2(auVar3,auVar44);
                  auVar39 = vpsubd_avx2(auVar48,auVar44);
                  auVar48 = vblendvps_avx(auVar2,auVar39,auVar11);
                  auVar2 = vpmaxsd_avx2(auVar12,auVar15);
                  *(undefined1 (*) [32])((long)*b_03 + lVar28) = auVar2;
                  *(undefined1 (*) [32])((long)*b_04 + lVar28) = auVar43;
                  *(undefined1 (*) [32])((long)*b_05 + lVar28) = auVar42;
                  *(undefined1 (*) [32])((long)*b_06 + lVar28) = auVar48;
                  auVar48 = vpsubd_avx2(auVar63,auVar17);
                  auVar42 = vpcmpgtd_avx2(auVar12,auVar48);
                  auVar43 = vblendvps_avx(auVar60._0_32_,auVar13,auVar42);
                  auVar60 = ZEXT3264(auVar43);
                  auVar43 = vpmaxsd_avx2(auVar12,auVar48);
                  auVar65 = ZEXT3264(auVar43);
                  auVar43 = vblendvps_avx(auVar45._0_32_,auVar10,auVar42);
                  auVar45 = ZEXT3264(auVar43);
                  auVar43 = vpsubd_avx2(auVar9,auVar44);
                  auVar9 = vblendvps_avx(auVar43,auVar39,auVar42);
                  auVar43 = *(undefined1 (*) [32])((long)*palVar29 + lVar28);
                  auVar42 = *(undefined1 (*) [32])((long)*palVar68 + lVar28);
                  auVar48 = *(undefined1 (*) [32])((long)*palVar34 + lVar28);
                  auVar10 = *(undefined1 (*) [32])((long)*ptr_01 + lVar28);
                  lVar28 = lVar28 + 0x20;
                } while (uVar36 << 5 != lVar28);
                auVar61 = ZEXT3264(auVar64);
                if (iVar30 == iVar25) {
                  local_250 = local_258;
                  local_208 = palVar23;
                }
                iVar25 = 0;
                auVar10._4_4_ = gap;
                auVar10._0_4_ = gap;
                auVar10._8_4_ = gap;
                auVar10._12_4_ = gap;
                auVar10._16_4_ = gap;
                auVar10._20_4_ = gap;
                auVar10._24_4_ = gap;
                auVar10._28_4_ = gap;
                auVar66 = ZEXT3264(local_1d8);
                auVar62 = ZEXT3264(auVar9);
                do {
                  auVar43 = vpermps_avx2(_DAT_00908cc0,auVar62._0_32_);
                  auVar43 = vblendps_avx(auVar43,ZEXT432(1),1);
                  auVar62 = ZEXT3264(auVar43);
                  auVar43 = vpermps_avx2(_DAT_00908cc0,auVar65._0_32_);
                  auVar43 = vblendps_avx(auVar43,ZEXT432((uint)-open),1);
                  auVar65 = ZEXT3264(auVar43);
                  alVar1 = palVar29[uVar20];
                  auVar43 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                  auVar43 = vpalignr_avx2((undefined1  [32])alVar1,auVar43,0xc);
                  auVar48 = auVar60._0_32_;
                  auVar42 = vperm2i128_avx2(auVar48,auVar48,0x28);
                  auVar42 = vpalignr_avx2(auVar48,auVar42,0xc);
                  auVar60 = ZEXT3264(auVar42);
                  auVar48 = auVar45._0_32_;
                  auVar42 = vperm2i128_avx2(auVar48,auVar48,0x28);
                  auVar42 = vpalignr_avx2(auVar48,auVar42,0xc);
                  auVar45 = ZEXT3264(auVar42);
                  lVar28 = 0;
                  do {
                    auVar43 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar28 + lVar33));
                    auVar42 = vpmaxsd_avx2(auVar43,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar43 = *(undefined1 (*) [32])((long)*b + lVar28);
                    auVar64 = auVar65._0_32_;
                    auVar9 = vpmaxsd_avx2(auVar43,auVar64);
                    *(undefined1 (*) [32])((long)*b + lVar28) = auVar9;
                    auVar42 = vpcmpeqd_avx2(auVar9,auVar42);
                    auVar43 = vpcmpgtd_avx2(auVar43,auVar64);
                    auVar48 = vpor_avx2(auVar42,auVar43);
                    auVar43 = vblendvps_avx(auVar60._0_32_,
                                            *(undefined1 (*) [32])((long)*b_00 + lVar28),auVar48);
                    *(undefined1 (*) [32])((long)*b_00 + lVar28) = auVar43;
                    auVar42 = vblendvps_avx(auVar45._0_32_,
                                            *(undefined1 (*) [32])((long)*b_01 + lVar28),auVar48);
                    *(undefined1 (*) [32])((long)*b_01 + lVar28) = auVar42;
                    auVar48 = vblendvps_avx(auVar62._0_32_,
                                            *(undefined1 (*) [32])((long)*b_02 + lVar28),auVar48);
                    *(undefined1 (*) [32])((long)*b_02 + lVar28) = auVar48;
                    auVar2 = vpmaxsd_avx2(auVar66._0_32_,auVar43);
                    auVar39 = vpmaxsd_avx2(auVar42,auVar48);
                    auVar3 = vpmaxsd_avx2(auVar2,auVar39);
                    auVar66 = ZEXT3264(auVar3);
                    auVar13 = vpmaxsd_avx2(auVar9,auVar61._0_32_);
                    auVar61 = ZEXT3264(auVar13);
                    auVar2._4_4_ = open;
                    auVar2._0_4_ = open;
                    auVar2._8_4_ = open;
                    auVar2._12_4_ = open;
                    auVar2._16_4_ = open;
                    auVar2._20_4_ = open;
                    auVar2._24_4_ = open;
                    auVar2._28_4_ = open;
                    auVar11 = vpsubd_avx2(auVar9,auVar2);
                    auVar64 = vpsubd_avx2(auVar64,auVar10);
                    auVar65 = ZEXT3264(auVar64);
                    auVar2 = vpcmpgtd_avx2(auVar64,auVar11);
                    auVar9 = vpcmpeqd_avx2(auVar64,auVar11);
                    auVar39 = vpcmpgtd_avx2(auVar64,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar9 = vpand_avx2(auVar9,auVar39);
                    auVar9 = vpor_avx2(auVar9,auVar2);
                    if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar9 >> 0x7f,0) == '\0') &&
                          (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar9 >> 0xbf,0) == '\0') &&
                        (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar9[0x1f]) goto LAB_0079d6ad;
                    auVar9 = vpcmpgtd_avx2(auVar11,auVar64);
                    auVar43 = vblendvps_avx(auVar60._0_32_,auVar43,auVar9);
                    auVar60 = ZEXT3264(auVar43);
                    auVar43 = vblendvps_avx(auVar45._0_32_,auVar42,auVar9);
                    auVar45 = ZEXT3264(auVar43);
                    auVar43 = vblendvps_avx(auVar62._0_32_,auVar48,auVar9);
                    auVar43 = vpsubd_avx2(auVar43,auVar44);
                    auVar62 = ZEXT3264(auVar43);
                    auVar43 = *(undefined1 (*) [32])((long)*palVar29 + lVar28);
                    lVar28 = lVar28 + 0x20;
                  } while (uVar36 << 5 != lVar28);
                  iVar25 = iVar25 + 1;
                } while (iVar25 != 8);
LAB_0079d6ad:
                auVar61 = ZEXT3264(auVar13);
                auVar43 = vpcmpgtd_avx2(auVar13,auVar38);
                local_258 = palVar29;
                if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar43 >> 0x7f,0) != '\0') ||
                      (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar43 >> 0xbf,0) != '\0') ||
                    (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar43[0x1f] < '\0') {
                  auVar38 = vpermq_avx2(auVar13,0x44);
                  auVar38 = vpmaxsd_avx2(auVar13,auVar38);
                  auVar43 = vpslldq_avx2(auVar38,8);
                  auVar38 = vpmaxsd_avx2(auVar38,auVar43);
                  auVar43 = vpslldq_avx2(auVar38,4);
                  auVar38 = vpmaxsd_avx2(auVar38,auVar43);
                  iVar67 = auVar38._28_4_;
                  if (0x7ffffffe - iVar26 < iVar67) {
                    *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                    goto LAB_0079d76b;
                  }
                  auVar44._8_4_ = 7;
                  auVar44._0_8_ = 0x700000007;
                  auVar44._12_4_ = 7;
                  auVar44._16_4_ = 7;
                  auVar44._20_4_ = 7;
                  auVar44._24_4_ = 7;
                  auVar44._28_4_ = 7;
                  auVar38 = vpermd_avx2(auVar44,auVar38);
                  iVar30 = (int)uVar31;
                }
                auVar45 = ZEXT3264(auVar38);
                uVar31 = uVar31 + 1;
                palVar22 = palVar68;
                palVar23 = palVar34;
                palVar24 = ptr_01;
              } while (uVar31 != iVar4 + 1U);
              uVar31 = (ulong)(iVar4 + 1U);
LAB_0079d76b:
              if ((iVar67 == 0x7fffffff) ||
                 (auVar39._8_4_ = 0x7fffffff, auVar39._0_8_ = 0x7fffffff7fffffff,
                 auVar39._12_4_ = 0x7fffffff, auVar39._16_4_ = 0x7fffffff,
                 auVar39._20_4_ = 0x7fffffff, auVar39._24_4_ = 0x7fffffff,
                 auVar39._28_4_ = 0x7fffffff, auVar38 = vpcmpeqd_avx2(auVar3,auVar39),
                 (((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar38 >> 0x7f,0) != '\0') ||
                   (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar38 >> 0xbf,0) != '\0') ||
                 (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar38[0x1f] < '\0')) {
                *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
              }
              iVar25 = parasail_result_is_saturated(result_00);
              iVar26 = 0;
              local_188 = local_250;
              palVar24 = palVar68;
              palVar23 = palVar34;
              palVar22 = b_00;
              palVar35 = b_01;
              local_1d8._0_8_ = local_208;
              if (iVar25 == 0) {
                if (iVar30 == (int)uVar31 + -1) {
                  local_d8 = SUB84(b_02,0);
                  uStack_d4 = (undefined4)((ulong)b_02 >> 0x20);
                  local_188 = b;
                  b = local_250;
                  b_02 = ptr_00;
                  palVar22 = ptr;
                  palVar35 = local_208;
                  ptr = b_00;
                  local_1d8._0_8_ = b_01;
                }
                else if (iVar30 == (int)uVar31 + -2) {
                  local_d8 = SUB84(ptr_01,0);
                  uStack_d4 = (undefined4)((ulong)ptr_01 >> 0x20);
                  local_188 = palVar29;
                  palVar24 = ptr;
                  palVar23 = local_208;
                  ptr_01 = ptr_00;
                  palVar29 = local_250;
                  ptr = palVar68;
                  local_1d8._0_8_ = palVar34;
                }
                else {
                  local_d8 = SUB84(ptr_00,0);
                  uStack_d4 = (undefined4)((ulong)ptr_00 >> 0x20);
                }
                ptr_00 = (__m256i *)CONCAT44(uStack_d4,local_d8);
                local_258 = palVar29;
                if ((uVar21 + 7 & 0x7ffffff8) == 0) {
                  iVar26 = -0x40000000;
                  iVar27 = -0x40000000;
                  iVar25 = -0x40000000;
                }
                else {
                  iVar25 = -0x40000000;
                  uVar36 = 0;
                  iVar27 = -0x40000000;
                  iVar26 = -0x40000000;
                  do {
                    if ((*(int *)((long)*local_188 + uVar36 * 4) == iVar67) &&
                       (uVar32 = ((uint)uVar36 & 7) * uVar16 + ((uint)(uVar36 >> 3) & 0x1fffffff),
                       (int)uVar32 < (int)uVar21)) {
                      iVar25 = *(int *)((long)*ptr + uVar36 * 4);
                      iVar26 = *(int *)((long)(longlong *)local_1d8._0_8_ + uVar36 * 4);
                      iVar27 = *(int *)((long)*ptr_00 + uVar36 * 4);
                      uVar21 = (ulong)uVar32;
                    }
                    uVar32 = (uint)uVar21;
                    uVar36 = uVar36 + 1;
                  } while ((uVar16 & 0xfffffff) << 3 != (int)uVar36);
                }
              }
              else {
                iVar27 = 0;
                iVar25 = 0;
                iVar67 = 0;
                iVar30 = 0;
                uVar32 = 0;
              }
              result_00->score = iVar67;
              result_00->end_query = uVar32;
              result_00->end_ref = iVar30;
              ((result_00->field_4).stats)->matches = iVar25;
              ((result_00->field_4).stats)->similar = iVar26;
              ((result_00->field_4).stats)->length = iVar27;
              parasail_free(ptr_00);
              parasail_free((void *)local_1d8._0_8_);
              parasail_free(ptr);
              parasail_free(local_188);
              parasail_free(b_06);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr_01);
              parasail_free(b_02);
              parasail_free(palVar23);
              parasail_free(palVar35);
              parasail_free(palVar24);
              parasail_free(palVar22);
              parasail_free(local_258);
              parasail_free(b);
            }
            else {
              result_00 = (parasail_result_t *)0x0;
            }
            goto LAB_0079daaf;
          }
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
LAB_0079daaf:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar19;
  result_00->end_ref = iVar4;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_32(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_32(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_32(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_32(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_32(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}